

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8AllCertificatesNoPoliciesTest2Subpart2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section8AllCertificatesNoPoliciesTest2Subpart2<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  
  PkitsTestInfo::PkitsTestInfo(&info);
  info.test_number = "4.8.2";
  info.should_validate = false;
  PkitsTestInfo::SetInitialExplicitPolicy(&info,true);
  PkitsTestInfo::SetUserConstrainedPolicySet(&info,"");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005a2ee0,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005a2f00,
             &info.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&info);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8AllCertificatesNoPoliciesTest2Subpart2) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "NoPoliciesCACert",
                               "AllCertificatesNoPoliciesTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "NoPoliciesCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.2";
  info.should_validate = false;
  info.SetInitialExplicitPolicy(true);
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}